

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O0

void __thiscall
random_tests::fastrandom_tests_nondeterministic::test_method
          (fastrandom_tests_nondeterministic *this)

{
  long lVar1;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> range;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> range_00;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> range_01;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> range_02;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> range_03;
  common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> range_04;
  bool bVar2;
  undefined1 uVar3;
  long in_FS_OFFSET;
  FastRandomContext *in_stack_ffffffffffffeb98;
  undefined7 in_stack_ffffffffffffeba0;
  undefined1 in_stack_ffffffffffffeba7;
  FastRandomContext *in_stack_ffffffffffffeba8;
  undefined7 in_stack_ffffffffffffebb0;
  undefined1 in_stack_ffffffffffffebb7;
  const_string *in_stack_ffffffffffffebc0;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffebc8;
  const_string *in_stack_ffffffffffffebd0;
  undefined7 in_stack_ffffffffffffebd8;
  undefined1 in_stack_ffffffffffffebdf;
  size_t len;
  undefined7 in_stack_ffffffffffffebe8;
  fastrandom_tests_nondeterministic *this_local;
  const_string local_11a0 [2];
  lazy_ostream local_1180 [2];
  const_string local_1160;
  RandomMixin<FastRandomContext> local_1148;
  assertion_result local_1130 [2];
  const_string local_10f8 [2];
  lazy_ostream local_10d8 [2];
  assertion_result local_10b8 [2];
  const_string local_1080 [2];
  lazy_ostream local_1060 [2];
  assertion_result local_1040 [2];
  const_string local_1008 [2];
  lazy_ostream local_fe8 [2];
  rep local_fc8;
  rep local_fb8;
  assertion_result local_fb0 [2];
  const_string local_f78 [2];
  lazy_ostream local_f58 [2];
  rep local_f38;
  rep local_f28;
  assertion_result local_f20 [2];
  const_string local_ee8 [2];
  lazy_ostream local_ec8 [2];
  assertion_result local_ea8 [2];
  const_string local_e70 [2];
  lazy_ostream local_e50 [2];
  assertion_result local_e30 [2];
  const_string local_df8 [2];
  lazy_ostream local_dd8 [2];
  rep local_db8;
  rep local_da8;
  assertion_result local_da0 [2];
  const_string local_d68 [2];
  lazy_ostream local_d48 [2];
  rep local_d28;
  rep local_d18;
  assertion_result local_d10 [2];
  const_string local_cd8 [2];
  lazy_ostream local_cb8 [2];
  assertion_result local_c98 [2];
  const_string local_c60 [2];
  lazy_ostream local_c40 [2];
  assertion_result local_c20 [2];
  const_string local_be8 [2];
  lazy_ostream local_bc8 [2];
  rep local_ba8;
  rep local_b98;
  assertion_result local_b90 [2];
  const_string local_b58 [2];
  lazy_ostream local_b38 [2];
  rep local_b18;
  rep local_b08;
  assertion_result local_b00 [2];
  const_string local_ac8 [2];
  lazy_ostream local_aa8 [2];
  assertion_result local_a88 [2];
  const_string local_a50 [2];
  lazy_ostream local_a30 [2];
  assertion_result local_a10 [2];
  FastRandomContext ctx4_2;
  FastRandomContext ctx3_2;
  FastRandomContext ctx4_1;
  FastRandomContext ctx3_1;
  FastRandomContext ctx4;
  FastRandomContext ctx3;
  
  local_1008[0].m_end = (iterator)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    RandomMixin<FastRandomContext>::rand<unsigned_long>
              (&in_stack_ffffffffffffeb98->super_RandomMixin<FastRandomContext>);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a10,local_a30,local_a50,0x55,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    RandomMixin<FastRandomContext>::rand<int>
              (&in_stack_ffffffffffffeb98->super_RandomMixin<FastRandomContext>);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a88,local_aa8,local_ac8,0x56,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    local_b18 = (rep)h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)
               CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffeb98);
    range.__r._7_1_ = in_stack_ffffffffffffebb7;
    range.__r._0_7_ = in_stack_ffffffffffffebb0;
    local_b08 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                               ((RandomMixin<FastRandomContext> *)
                                CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),range)
    ;
    std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b00,local_b38,local_b58,0x57,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    local_ba8 = (rep)h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffeb98);
    range_00.__r._7_1_ = in_stack_ffffffffffffebb7;
    range_00.__r._0_7_ = in_stack_ffffffffffffebb0;
    local_b98 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                               ((RandomMixin<FastRandomContext> *)
                                CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
                                range_00);
    std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b90,local_bc8,local_be8,0x58,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    RandomMixin<FastRandomContext>::rand<unsigned_long>
              (&in_stack_ffffffffffffeb98->super_RandomMixin<FastRandomContext>);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c20,local_c40,local_c60,0x5a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    RandomMixin<FastRandomContext>::rand<int>
              (&in_stack_ffffffffffffeb98->super_RandomMixin<FastRandomContext>);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c98,local_cb8,local_cd8,0x5b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    local_d28 = (rep)h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)
               CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffeb98);
    range_01.__r._7_1_ = in_stack_ffffffffffffebb7;
    range_01.__r._0_7_ = in_stack_ffffffffffffebb0;
    local_d18 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                               ((RandomMixin<FastRandomContext> *)
                                CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
                                range_01);
    std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d10,local_d48,local_d68,0x5c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    local_db8 = (rep)h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffeb98);
    range_02.__r._7_1_ = in_stack_ffffffffffffebb7;
    range_02.__r._0_7_ = in_stack_ffffffffffffebb0;
    local_da8 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                               ((RandomMixin<FastRandomContext> *)
                                CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
                                range_02);
    std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_da0,local_dd8,local_df8,0x5d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    RandomMixin<FastRandomContext>::rand<unsigned_long>
              (&in_stack_ffffffffffffeb98->super_RandomMixin<FastRandomContext>);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e30,local_e50,local_e70,0x5f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    RandomMixin<FastRandomContext>::rand<int>
              (&in_stack_ffffffffffffeb98->super_RandomMixin<FastRandomContext>);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ea8,local_ec8,local_ee8,0x60,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    local_f38 = (rep)h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)
               CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffeb98);
    range_03.__r._7_1_ = in_stack_ffffffffffffebb7;
    range_03.__r._0_7_ = in_stack_ffffffffffffebb0;
    local_f28 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                               ((RandomMixin<FastRandomContext> *)
                                CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
                                range_03);
    std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f20,local_f58,local_f78,0x61,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    local_fc8 = (rep)h<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_ffffffffffffeb98);
    range_04.__r._7_1_ = in_stack_ffffffffffffebb7;
    range_04.__r._0_7_ = in_stack_ffffffffffffebb0;
    local_fb8 = (rep)RandomMixin<FastRandomContext>::
                     randrange<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                               ((RandomMixin<FastRandomContext> *)
                                CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
                                range_04);
    std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_fb0,local_fe8,local_1008,0x62,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
  FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    FastRandomContext::rand64
              ((FastRandomContext *)CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0));
    FastRandomContext::rand64
              ((FastRandomContext *)CONCAT17(in_stack_ffffffffffffebb7,in_stack_ffffffffffffebb0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1040,local_1060,local_1080,0x67,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
  FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
  FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
  FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    RandomMixin<FastRandomContext>::rand256(in_stack_ffffffffffffebc8);
    RandomMixin<FastRandomContext>::rand256(in_stack_ffffffffffffebc8);
    ::operator!=((base_blob<256U> *)in_stack_ffffffffffffeba8,
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10b8,local_10d8,local_10f8,0x6b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar3);
  FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
  FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
  FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
  FastRandomContext::FastRandomContext(in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
  do {
    len = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffebdf,in_stack_ffffffffffffebd8),
               in_stack_ffffffffffffebd0,(size_t)in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0
              );
    in_stack_ffffffffffffebc8 = &local_1148;
    in_stack_ffffffffffffebc0 = (const_string *)0x7;
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              ((RandomMixin<FastRandomContext> *)CONCAT17(uVar3,in_stack_ffffffffffffebe8),len);
    in_stack_ffffffffffffebd0 = &local_1160;
    RandomMixin<FastRandomContext>::randbytes<unsigned_char>
              ((RandomMixin<FastRandomContext> *)CONCAT17(uVar3,in_stack_ffffffffffffebe8),len);
    in_stack_ffffffffffffebdf =
         std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_ffffffffffffebc8,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_ffffffffffffebc0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffeba8,(bool)in_stack_ffffffffffffeba7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeb98);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeba8,
               (pointer)CONCAT17(in_stack_ffffffffffffeba7,in_stack_ffffffffffffeba0),
               (unsigned_long)in_stack_ffffffffffffeb98);
    in_stack_ffffffffffffeb98 = (FastRandomContext *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1130,local_1180,local_11a0,0x6f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeb98);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeb98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
  FastRandomContext::~FastRandomContext(in_stack_ffffffffffffeb98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_tests_nondeterministic)
{
    // Check that a nondeterministic ones are not
    {
        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{9330418229102544152u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{618925161});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 1271170921);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 2803534);

        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{10170981140880778086u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{1689082725});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 2464643716);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 2312205);

        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{5689404004456455543u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{785839937});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 93558804);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 507022);
    }

    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.rand64() != ctx4.rand64()); // extremely unlikely to be equal
    }
    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.rand256() != ctx4.rand256());
    }
    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.randbytes(7) != ctx4.randbytes(7));
    }
}